

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynContinue * ParseContinue(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynNumber *pSVar2;
  undefined4 extraout_var;
  SynContinue *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_continue) {
    ctx->currentLexeme = begin + 1;
    pSVar2 = ParseNumber(ctx);
    anon_unknown.dwarf_15703::CheckConsume
              (ctx,lex_semicolon,"ERROR: continue statement must be followed by \';\' or a constant"
              );
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynContinue *)CONCAT44(extraout_var,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this,0x25,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247a70;
    this->number = pSVar2;
  }
  else {
    this = (SynContinue *)0x0;
  }
  return this;
}

Assistant:

SynContinue* ParseContinue(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_continue))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: continue statement must be followed by ';' or a constant");

		return new (ctx.get<SynContinue>()) SynContinue(start, ctx.Previous(), node);
	}

	return NULL;
}